

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

size_type __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>::
count_multi<long>(btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                  *this,long *key)

{
  size_type sVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_const_long_&,_const_long_*>
  local_38;
  
  cVar2 = lower_bound<long>(this,key);
  cVar3 = upper_bound<long>(this,key);
  if (cVar2.position == cVar3.position && cVar2.node == cVar3.node) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    local_38.node = cVar2.node;
    local_38.position = cVar2.position;
    do {
      do {
        btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_const_long_&,_const_long_*>
        ::increment(&local_38);
        sVar1 = sVar1 + 1;
      } while (local_38.node != cVar3.node);
    } while (local_38.position != cVar3.position);
  }
  return sVar1;
}

Assistant:

size_type count_multi(const K &key) const {
            const auto range = equal_range(key);
            return std::distance(range.first, range.second);
        }